

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialDistribution.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<15>::PartialDistribution::~PartialDistribution
          (PartialDistribution *this)

{
  InterpolationSequenceRecord<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution>
  ::~InterpolationSequenceRecord(&(this->distribution_).data_);
  TabulationRecord::~TabulationRecord((TabulationRecord *)this);
  return;
}

Assistant:

class ENDFTK_PYTHON_EXPORT PartialDistribution {

  Probability probability_;
  Distribution distribution_;

  /* auxiliary functions */
  #include "ENDFtk/section/15/PartialDistribution/src/verifyLF.hpp"
  #include "ENDFtk/section/15/PartialDistribution/src/readPartialDistribution.hpp"

public:

  /* constructor */
  #include "ENDFtk/section/15/PartialDistribution/src/ctor.hpp"

  /* get methods */

  /**
   *  @brief Return the probability
   */
  const Probability& probability() const { return this->probability_; }

  /**
   *  @brief Return the distribution
   */
  const Distribution& distribution() const { return this->distribution_; }

  #include "ENDFtk/section/15/PartialDistribution/src/NC.hpp"
  #include "ENDFtk/section/15/PartialDistribution/src/print.hpp"
}